

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  string local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---------------",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"nfa0","");
  create_dfa(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {
    cout << "---------------" << endl;
    create_dfa("nfa0");

    /*
    create_dfa("nfa1");
    create_dfa("nfa2");
    create_dfa("nfa3");
    create_dfa("nfa4");
    */
    return 0;
}